

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprTypesTest_Typedefs_Test::~ExprTypesTest_Typedefs_Test(ExprTypesTest_Typedefs_Test *this)

{
  void *in_RDI;
  
  ~ExprTypesTest_Typedefs_Test((ExprTypesTest_Typedefs_Test *)0x162748);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ExprTypesTest, Typedefs) {
  using mp::internal::ExprTypes;
  CHECK_EXPR_TYPE(NumericExpr);
  CHECK_EXPR_TYPE(LogicalExpr);
  CHECK_EXPR_TYPE(NumericConstant);
  EXPECT_TRUE((IsSame<ExprTypes::Variable, mp::Reference>::VALUE));
  CHECK_EXPR_TYPE(UnaryExpr);
  CHECK_EXPR_TYPE(BinaryExpr);
  CHECK_EXPR_TYPE(IfExpr);
  CHECK_EXPR_TYPE(PLTerm);
  CHECK_EXPR_TYPE(CallExpr);
  EXPECT_TRUE((IsSame<ExprTypes::VarArgExpr, mp::IteratedExpr>::VALUE));
  EXPECT_TRUE((IsSame<ExprTypes::SumExpr, mp::IteratedExpr>::VALUE));
  EXPECT_TRUE((IsSame<ExprTypes::NumberOfExpr, mp::IteratedExpr>::VALUE));
  CHECK_EXPR_TYPE(CountExpr);
  CHECK_EXPR_TYPE(LogicalConstant);
  CHECK_EXPR_TYPE(NotExpr);
  CHECK_EXPR_TYPE(BinaryLogicalExpr);
  CHECK_EXPR_TYPE(RelationalExpr);
  CHECK_EXPR_TYPE(LogicalCountExpr);
  CHECK_EXPR_TYPE(ImplicationExpr);
  CHECK_EXPR_TYPE(IteratedLogicalExpr);
  CHECK_EXPR_TYPE(PairwiseExpr);
}